

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_recall_monster(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  monster_lore *lore;
  monster_race *pmVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  char c;
  wchar_t r_idx;
  char s [80];
  byte local_8d;
  wchar_t local_8c;
  char local_88 [88];
  
  local_8c = (wchar_t)z_info->r_max;
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"index",&local_8c);
  if (wVar2 != L'\0') {
    local_88[0x40] = '\0';
    local_88[0x41] = '\0';
    local_88[0x42] = '\0';
    local_88[0x43] = '\0';
    local_88[0x44] = '\0';
    local_88[0x45] = '\0';
    local_88[0x46] = '\0';
    local_88[0x47] = '\0';
    local_88[0x48] = '\0';
    local_88[0x49] = '\0';
    local_88[0x4a] = '\0';
    local_88[0x4b] = '\0';
    local_88[0x4c] = '\0';
    local_88[0x4d] = '\0';
    local_88[0x4e] = '\0';
    local_88[0x4f] = '\0';
    local_88[0x30] = '\0';
    local_88[0x31] = '\0';
    local_88[0x32] = '\0';
    local_88[0x33] = '\0';
    local_88[0x34] = '\0';
    local_88[0x35] = '\0';
    local_88[0x36] = '\0';
    local_88[0x37] = '\0';
    local_88[0x38] = '\0';
    local_88[0x39] = '\0';
    local_88[0x3a] = '\0';
    local_88[0x3b] = '\0';
    local_88[0x3c] = '\0';
    local_88[0x3d] = '\0';
    local_88[0x3e] = '\0';
    local_88[0x3f] = '\0';
    local_88[0x20] = '\0';
    local_88[0x21] = '\0';
    local_88[0x22] = '\0';
    local_88[0x23] = '\0';
    local_88[0x24] = '\0';
    local_88[0x25] = '\0';
    local_88[0x26] = '\0';
    local_88[0x27] = '\0';
    local_88[0x28] = '\0';
    local_88[0x29] = '\0';
    local_88[0x2a] = '\0';
    local_88[0x2b] = '\0';
    local_88[0x2c] = '\0';
    local_88[0x2d] = '\0';
    local_88[0x2e] = '\0';
    local_88[0x2f] = '\0';
    local_88[0x10] = '\0';
    local_88[0x11] = '\0';
    local_88[0x12] = '\0';
    local_88[0x13] = '\0';
    local_88[0x14] = '\0';
    local_88[0x15] = '\0';
    local_88[0x16] = '\0';
    local_88[0x17] = '\0';
    local_88[0x18] = '\0';
    local_88[0x19] = '\0';
    local_88[0x1a] = '\0';
    local_88[0x1b] = '\0';
    local_88[0x1c] = '\0';
    local_88[0x1d] = '\0';
    local_88[0x1e] = '\0';
    local_88[0x1f] = '\0';
    local_88[0] = '\0';
    local_88[1] = '\0';
    local_88[2] = '\0';
    local_88[3] = '\0';
    local_88[4] = '\0';
    local_88[5] = '\0';
    local_88[6] = '\0';
    local_88[7] = '\0';
    local_88[8] = '\0';
    local_88[9] = '\0';
    local_88[10] = '\0';
    local_88[0xb] = '\0';
    local_88[0xc] = '\0';
    local_88[0xd] = '\0';
    local_88[0xe] = '\0';
    local_88[0xf] = '\0';
    _Var1 = get_com("Full recall for [a]ll monsters or [s]pecific monster? ",(char *)&local_8d);
    if (!_Var1) {
      return;
    }
    if ((local_8d & 0xdf) == 0x53) {
      _Var1 = get_string("Which monster? ",local_88,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(local_88,&local_8c);
      if ((!_Var1) && (pmVar3 = lookup_monster(local_88), pmVar3 != (monster_race *)0x0)) {
        local_8c = pmVar3->ridx;
      }
    }
    else {
      if ((local_8d & 0xdf) != 0x41) {
        return;
      }
      local_8c = L'\xffffffff';
    }
    cmd_set_arg_number((command_conflict *)cmd,"index",local_8c);
  }
  if (((long)local_8c < 0) || ((int)(uint)z_info->r_max <= local_8c)) {
    if (local_8c == L'\xffffffff') {
      if (z_info->r_max != 0) {
        lVar4 = 0;
        lVar6 = 0;
        uVar5 = 0;
        do {
          cheat_monster_lore((monster_race *)(r_info->flags + lVar4 + -0x5c),
                             (monster_lore *)(l_list->flags + lVar6 + -0x20));
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0x78;
          lVar4 = lVar4 + 0xd0;
        } while (uVar5 < z_info->r_max);
      }
    }
    else {
      msg("No monster found.");
    }
  }
  else {
    pmVar3 = r_info + local_8c;
    lore = get_lore(pmVar3);
    cheat_monster_lore(pmVar3,lore);
  }
  return;
}

Assistant:

void do_cmd_wiz_recall_monster(struct command *cmd)
{
	int r_idx = z_info->r_max;

	if (cmd_get_arg_number(cmd, "index", &r_idx) != CMD_OK) {
		char s[80] = "";
		char c;

		if (!get_com("Full recall for [a]ll monsters or [s]pecific monster? ", &c)) return;
		if (c == 'a' || c == 'A') {
			r_idx = -1;
		} else if (c == 's' || c == 'S') {
			if (!get_string("Which monster? ", s, sizeof(s)))
				return;
			if (!get_int_from_string(s, &r_idx)) {
				const struct monster_race *race =
					lookup_monster(s);

				if (race) {
					r_idx = race->ridx;
				}
			}
		} else {
			return;
		}
		cmd_set_arg_number(cmd, "index", r_idx);
	}

	if (r_idx >= 0 && r_idx < z_info->r_max) {
		const struct monster_race *race = &r_info[r_idx];

		cheat_monster_lore(race, get_lore(race));
	} else if (r_idx == -1) {
		int i;

		for (i = 0; i < z_info->r_max; i++) {
			cheat_monster_lore(&r_info[i], &l_list[i]);
		}
	} else {
		msg("No monster found.");
	}
}